

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  LodePNGColorType colortype;
  byte b_00;
  byte g_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  size_t i;
  byte bVar9;
  ulong uVar10;
  size_t sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_116;
  unsigned_short local_114;
  unsigned_short local_112;
  unsigned_short local_110;
  byte local_10d;
  uint local_10c;
  uint local_108;
  byte local_101;
  ulong local_100;
  size_t local_f8;
  uint local_ec;
  LodePNGColorMode *local_e8;
  uchar *local_e0;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  undefined4 local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  
  local_f8 = (ulong)h * (ulong)w;
  colortype = mode_in->colortype;
  local_e0 = in;
  uVar2 = lodepng_can_have_alpha(mode_in);
  uVar6 = mode_in->bitdepth;
  local_e8 = mode_in;
  local_d0 = getNumColorChannels(colortype);
  local_d0 = local_d0 * uVar6;
  uVar6 = stats->bits;
  local_108 = CONCAT31(local_108._1_3_,local_d0 == 1 && uVar6 == 1);
  local_cc = 0x101;
  if ((local_d0 < 9) &&
     (local_cc = (1 << ((byte)local_d0 & 0x1f)) + stats->numcolors, 0x100 < local_cc)) {
    local_cc = 0x101;
  }
  local_100 = CONCAT71(local_100._1_7_,(colortype & ~LCT_GREY_ALPHA) == LCT_GREY);
  stats->numpixels = stats->numpixels + local_f8;
  bVar14 = stats->allow_palette == 0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_38 = -1;
  uVar7 = 1;
  if (stats->alpha == 0) {
    uVar7 = uVar2 ^ 1;
  }
  uVar5 = (ulong)uVar7;
  local_10c = CONCAT31(local_10c._1_3_,stats->colored != 0);
  bVar12 = local_d0 <= uVar6;
  bVar13 = local_cc <= stats->numcolors;
  local_ec = 0;
  if (((uVar6 != 0x10 && !bVar14) && !bVar13) && (local_ec = 0, stats->numcolors != 0)) {
    uVar10 = 0;
    do {
      local_ec = color_tree_add((ColorTree *)local_b8,stats->palette[uVar10 * 4],
                                stats->palette[uVar10 * 4 + 1],stats->palette[uVar10 * 4 + 2],
                                stats->palette[uVar10 * 4 + 3],(uint)uVar10);
      if (local_ec != 0) goto LAB_001e3dc3;
      uVar10 = uVar10 + 1;
    } while (uVar10 < stats->numcolors);
  }
  bVar4 = (byte)local_100 | (byte)local_10c;
  local_108 = (uint)(bVar12 | (byte)local_108);
  local_10c = (uint)((uVar6 == 0x10 || bVar14) || bVar13);
  bVar14 = true;
  if (local_e8->bitdepth == 0x10) {
    local_112 = 0;
    local_114 = 0;
    local_116 = 0;
    local_110 = 0;
    bVar14 = local_f8 == 0;
    if (!bVar14) {
      local_100 = CONCAT71(local_100._1_7_,bVar4);
      getPixelColorRGBA16(&local_112,&local_114,&local_116,&local_110,local_e0,0,local_e8);
      if ((local_112 & 0xff) == local_112 >> 8) {
        sVar11 = 1;
        do {
          if ((((local_114 & 0xff) != local_114 >> 8) || ((local_116 & 0xff) != local_116 >> 8)) ||
             ((local_110 & 0xff) != local_110 >> 8)) break;
          bVar14 = local_f8 == sVar11;
          if (bVar14) goto LAB_001e36f8;
          getPixelColorRGBA16(&local_112,&local_114,&local_116,&local_110,local_e0,sVar11,local_e8);
          sVar11 = sVar11 + 1;
        } while ((local_112 & 0xff) == local_112 >> 8);
      }
      stats->bits = 0x10;
      local_108 = 1;
      local_10c = 1;
LAB_001e36f8:
      bVar4 = (byte)local_100;
    }
  }
  uVar6 = local_10c;
  if (bVar14) {
    local_112 = local_112 & 0xff00;
    local_114 = local_114 & 0xff00;
    local_116 = local_116 & 0xff00;
    local_110 = local_110 & 0xff00;
    if (local_f8 != 0) {
      local_d4 = (uint)bVar4;
      sVar11 = 0;
      local_100 = 0;
      bVar8 = 0;
      bVar4 = 0;
      bVar9 = 0;
      do {
        getPixelColorRGBA8((uchar *)&local_112,(uchar *)&local_114,(uchar *)&local_116,
                           (uchar *)&local_110,local_e0,sVar11,local_e8);
        bVar1 = (byte)local_112;
        g_00 = (byte)local_114;
        b_00 = (byte)local_116;
        if (((byte)local_110 != (byte)local_100 ||
            ((byte)local_116 != bVar8 || ((byte)local_114 != bVar4 || (byte)local_112 != bVar9))) ||
            sVar11 == 0) {
          local_100 = CONCAT71(local_100._1_7_,(byte)local_110);
          uVar6 = (uint)(byte)local_112;
          if ((local_108 == 0) && (stats->bits < 8)) {
            uVar2 = 1;
            if ((1 < (byte)((byte)local_112 + 1)) && (uVar2 = 8, uVar6 * -0xf0f0f0f < 0xf0f0f10)) {
              uVar2 = (uint)(0x3030303 < uVar6 * -0x3030303) * 2 + 2;
            }
            if (stats->bits < uVar2) {
              stats->bits = uVar2;
            }
          }
          local_108 = stats->bits;
          local_101 = local_d0 <= local_108;
          local_c0 = 1;
          bVar9 = 1;
          local_bc = (undefined4)CONCAT71((int7)(uVar5 >> 8),1);
          bVar14 = local_d4 == 0;
          local_d4 = 1;
          if (bVar14) {
            local_bc = 0;
            local_d4 = 0;
            if ((byte)local_112 != (byte)local_116 || (byte)local_112 != (byte)local_114) {
              stats->colored = 1;
              local_bc = 1;
              local_d4 = 1;
              if (local_108 < 8) {
                stats->bits = 8;
                local_bc = 1;
              }
            }
          }
          uVar10 = (ulong)CONCAT31((int3)(local_108 >> 8),(byte)local_110);
          local_d8 = (uint)(byte)local_114;
          if ((int)uVar5 == 0) {
            if ((stats->key_r == (local_112 & 0xff)) && (stats->key_g == (local_114 & 0xff))) {
              bVar14 = stats->key_b == (local_116 & 0xff);
            }
            else {
              bVar14 = false;
            }
            if ((byte)local_110 == 0xff) {
              bVar9 = 0;
              local_c0 = 0;
              if ((bool)(stats->key != 0 & bVar14)) {
                stats->alpha = 1;
                stats->key = 0;
                if (stats->bits < 8) {
                  stats->bits = 8;
                }
                bVar9 = 1;
                local_c0 = 1;
              }
            }
            else if (((byte)local_110 == 0) && ((bool)(stats->key == 0 | bVar14))) {
              local_c0 = 0;
              if ((stats->alpha == 0) && (stats->key == 0)) {
                stats->key = 1;
                stats->key_r = local_112 & 0xff;
                stats->key_g = local_114 & 0xff;
                stats->key_b = local_116 & 0xff;
                bVar9 = 0;
                local_c0 = 0;
              }
              else {
                bVar9 = 0;
              }
            }
            else {
              stats->alpha = 1;
              stats->key = 0;
              if (stats->bits < 8) {
                stats->bits = 8;
                goto LAB_001e389b;
              }
            }
          }
          else {
LAB_001e389b:
            bVar9 = 1;
          }
          uVar2 = 1;
          bVar4 = (byte)local_114;
          bVar8 = (byte)local_116;
          if (local_10c == 0) {
            local_c4 = (uint)(byte)local_110;
            local_10d = (byte)local_114;
            local_10c = (uint)(byte)local_116;
            local_c8 = uVar6;
            iVar3 = color_tree_get((ColorTree *)local_b8,(byte)local_112,(byte)local_114,
                                   (byte)local_116,(byte)local_110);
            uVar10 = CONCAT71((int7)((ulong)extraout_RDX >> 8),(byte)local_100);
            uVar2 = 0;
            bVar4 = local_10d;
            bVar8 = (byte)local_10c;
            if (iVar3 < 0) {
              local_ec = color_tree_add((ColorTree *)local_b8,(uchar)local_c8,g_00,b_00,
                                        (uchar)local_c4,stats->numcolors);
              if (local_ec != 0) goto LAB_001e3dc3;
              uVar6 = stats->numcolors;
              uVar10 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),(byte)local_100);
              if ((ulong)uVar6 < 0x100) {
                uVar5 = (ulong)(uVar6 * 4);
                stats->palette[(ulong)uVar6 * 4] = bVar1;
                stats->palette[uVar5 + 1] = local_10d;
                stats->palette[uVar5 + 2] = (byte)local_10c;
                stats->palette[uVar5 + 3] = (byte)local_100;
              }
              stats->numcolors = uVar6 + 1;
              uVar2 = (uint)(local_cc <= uVar6 + 1);
              local_ec = 0;
              bVar4 = local_10d;
              bVar8 = (byte)local_10c;
            }
          }
          if (((byte)local_bc & bVar9 & (byte)uVar2 & local_d0 <= local_108) != 0) break;
          local_108 = (uint)local_101;
          local_100 = uVar10 & 0xffffffff;
          uVar5 = (ulong)local_c0;
          local_10c = uVar2;
          bVar9 = bVar1;
        }
        sVar11 = sVar11 + 1;
      } while (local_f8 != sVar11);
    }
    if ((stats->key != 0) && (local_f8 != 0 && stats->alpha == 0)) {
      sVar11 = 0;
      do {
        getPixelColorRGBA8((uchar *)&local_112,(uchar *)&local_114,(uchar *)&local_116,
                           (uchar *)&local_110,local_e0,sVar11,local_e8);
        if (((((byte)local_110 != '\0') && (stats->key_r == (local_112 & 0xff))) &&
            (stats->key_g == (local_114 & 0xff))) && (stats->key_b == (local_116 & 0xff))) {
          stats->alpha = 1;
          stats->key = 0;
          if (stats->bits < 8) {
            stats->bits = 8;
          }
        }
        sVar11 = sVar11 + 1;
      } while (local_f8 != sVar11);
    }
    uVar5._0_2_ = stats->key_r;
    uVar5._2_2_ = stats->key_g;
    uVar5._4_2_ = stats->key_b;
    uVar5._6_2_ = *(undefined2 *)&stats->field_0xe;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar5;
    auVar15 = psllw(auVar15,8);
    stats->key_r = auVar15._0_2_ + (undefined2)uVar5;
    stats->key_g = auVar15._2_2_ + uVar5._2_2_;
    stats->key_b = (short)(*(int *)&stats->key_b << 8) + (short)*(int *)&stats->key_b;
  }
  else {
    local_112 = 0;
    local_114 = 0;
    local_116 = 0;
    local_110 = 0;
    if (local_f8 != 0) {
      sVar11 = local_f8 - 1;
      i = 0;
      do {
        getPixelColorRGBA16(&local_112,&local_114,&local_116,&local_110,local_e0,i,local_e8);
        bVar8 = 1;
        bVar14 = bVar4 == 0;
        bVar4 = 1;
        if (bVar14) {
          if (local_112 == local_114) {
            bVar8 = 0;
            bVar4 = 0;
            if (local_112 == local_116) goto LAB_001e3b5f;
          }
          stats->colored = 1;
          bVar8 = 1;
          bVar4 = 1;
        }
LAB_001e3b5f:
        if ((int)uVar5 == 0) {
          if ((local_112 == stats->key_r) && (local_114 == stats->key_g)) {
            bVar14 = local_116 == stats->key_b;
          }
          else {
            bVar14 = false;
          }
          if (local_110 == 0xffff) {
            bVar9 = 0;
            uVar5 = 0;
            if ((bool)(stats->key != 0 & bVar14)) goto LAB_001e3bed;
          }
          else {
            if ((local_110 != 0) || (stats->key != 0 && !bVar14)) {
LAB_001e3bed:
              stats->alpha = 1;
              stats->key = 0;
              goto LAB_001e3bfd;
            }
            uVar5 = 0;
            if ((stats->alpha == 0) && (stats->key == 0)) {
              stats->key = 1;
              stats->key_r = local_112;
              stats->key_g = local_114;
              stats->key_b = local_116;
              bVar9 = 0;
              uVar5 = 0;
            }
            else {
              bVar9 = 0;
            }
          }
        }
        else {
LAB_001e3bfd:
          bVar9 = 1;
          uVar5 = 1;
        }
      } while (((bVar8 & bVar9 & (byte)uVar6 & local_108 != 0) == 0) &&
              (bVar14 = sVar11 != i, i = i + 1, bVar14));
    }
    if ((stats->key != 0) && (local_f8 != 0 && stats->alpha == 0)) {
      sVar11 = 0;
      do {
        getPixelColorRGBA16(&local_112,&local_114,&local_116,&local_110,local_e0,sVar11,local_e8);
        if ((((local_110 != 0) && (local_112 == stats->key_r)) && (local_114 == stats->key_g)) &&
           (local_116 == stats->key_b)) {
          stats->alpha = 1;
          stats->key = 0;
        }
        sVar11 = sVar11 + 1;
      } while (local_f8 != sVar11);
    }
  }
LAB_001e3dc3:
  color_tree_cleanup((ColorTree *)local_b8);
  return local_ec;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
                                     const unsigned char* in, unsigned w, unsigned h,
                                     const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if(!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(stats->alpha) alpha_done = 1;
  if(stats->colored) colored_done = 1;
  if(stats->bits == 16) numcolors_done = 1;
  if(stats->bits >= bpp) bits_done = 1;
  if(stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done) {
    for(i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], (unsigned)i);
      if(error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  } else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    unsigned char pr = 0, pg = 0, pb = 0, pa = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      /*skip if color same as before, this speeds up large non-photographic
      images with many same colors by avoiding 'color_tree_has' below */
      if(i != 0 && r == pr && g == pg && b == pb && a == pa) continue;
      pr = r;
      pg = g;
      pb = b;
      pa = a;

      if(!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if(stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done) {
        if(!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if(error) goto cleanup;
          if(stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}